

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbdCut.c
# Opt level: O3

int Sbd_StoComputeCutsNode(Sbd_Sto_t *p,int iObj)

{
  uint uVar1;
  int iVar2;
  undefined8 uVar3;
  int *piVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  
  if (-1 < iObj) {
    if (iObj < p->pGia->nObjs) {
      uVar3 = *(undefined8 *)(p->pGia->pObjs + (uint)iObj);
      uVar5 = iObj - ((uint)uVar3 & 0x1fffffff);
      if (-1 < (int)uVar5) {
        uVar1 = p->vLevels->nSize;
        if ((((int)uVar5 < (int)uVar1) &&
            (uVar7 = iObj - ((uint)((ulong)uVar3 >> 0x20) & 0x1fffffff), -1 < (int)uVar7)) &&
           (uVar7 < uVar1)) {
          piVar4 = p->vLevels->pArray;
          iVar2 = piVar4[uVar5];
          iVar6 = piVar4[uVar7];
          if (iVar6 < iVar2) {
            iVar6 = iVar2;
          }
          Sbd_StoComputeCutsObj(p,iObj,-1,iVar6 + 1);
          Sbd_StoMergeCuts(p,iObj);
          if (iObj < p->vDelays->nSize) {
            return p->vDelays->pArray[(uint)iObj];
          }
        }
      }
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
  }
  __assert_fail("v >= 0 && v < p->nObjs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
}

Assistant:

int Sbd_StoComputeCutsNode( Sbd_Sto_t * p, int iObj )
{
    Gia_Obj_t * pObj = Gia_ManObj(p->pGia, iObj);
    int Lev0 = Vec_IntEntry( p->vLevels, Gia_ObjFaninId0(pObj, iObj) );
    int Lev1 = Vec_IntEntry( p->vLevels, Gia_ObjFaninId1(pObj, iObj) );
    Sbd_StoComputeCutsObj( p, iObj, -1, 1 + Abc_MaxInt(Lev0, Lev1) );
    Sbd_StoMergeCuts( p, iObj );
    return Vec_IntEntry( p->vDelays, iObj );
}